

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void setmangry(monst *mtmp)

{
  short sVar1;
  level *lev;
  boolean bVar2;
  char rmno;
  byte bVar3;
  short sVar4;
  char *pcVar5;
  monst *mtmp_00;
  char *local_40;
  int local_24;
  monst *pmStack_20;
  int got_mad;
  monst *mon;
  monst *shkp;
  monst *mtmp_local;
  
  mtmp->mstrategy = mtmp->mstrategy & 0xcfffffff;
  bVar2 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if (((bVar2 != '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) &&
     ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0)) {
    blkmar_guards(mtmp);
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
    if ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0) {
      adjalign(-1);
    }
    else {
      bVar2 = p_coaligned(mtmp);
      if (bVar2 == '\0') {
        adjalign(2);
      }
      else {
        adjalign(-5);
      }
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0) {
      if ((((mtmp->data->mflags1 & 0x20000) == 0) && ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0)
          ) && ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)) {
        if ((flags.verbose != '\0') && (flags.soundok != '\0')) {
          growl(mtmp);
        }
      }
      else {
        pcVar5 = Monnam(mtmp);
        pline("%s gets angry!",pcVar5);
      }
    }
    bVar2 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    lev = level;
    if (bVar2 != '\0') {
      if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0) {
        if (((undefined1 *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth) !=
             (undefined1 *)0x0) &&
           (*(char *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth) != '\0')) {
          rmno = inside_shop(level,mtmp->mx,mtmp->my);
          mtmp_00 = shop_keeper(lev,rmno);
          if (mtmp_00 != (monst *)0x0) {
            wakeup(mtmp_00);
          }
        }
      }
      else {
        blkmar_guards(mtmp);
      }
    }
    if ((flags.mon_moving == '\0') && (sVar1 = mtmp->mnum, sVar4 = quest_info(0x1f), sVar1 == sVar4)
       ) {
      local_24 = 0;
      for (pmStack_20 = level->monlist; pmStack_20 != (monst *)0x0; pmStack_20 = pmStack_20->nmon) {
        if (((0 < pmStack_20->mhp) && (pmStack_20->data == &pm_guardian)) &&
           ((*(uint *)&pmStack_20->field_0x60 >> 0x16 & 1) != 0)) {
          *(uint *)&pmStack_20->field_0x60 = *(uint *)&pmStack_20->field_0x60 & 0xffbfffff;
          if (pmStack_20->wormno == '\0') {
            if ((viz_array[pmStack_20->my][pmStack_20->mx] & 2U) == 0) {
              if (((((u.uprops[0x1e].intrinsic != 0) ||
                    ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                  ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                 (((u.uprops[0x40].intrinsic == 0 &&
                   ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))
                  || ((pmStack_20->data->mflags3 & 0x200) == 0)))) goto LAB_0024ecd3;
              bVar3 = viz_array[pmStack_20->my][pmStack_20->mx] & 1;
              goto joined_r0x0024ec39;
            }
          }
          else {
            bVar3 = worm_known(level,pmStack_20);
joined_r0x0024ec39:
            if (bVar3 == 0) goto LAB_0024ecd3;
          }
          if ((((((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0) ||
                (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
              (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&pmStack_20->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&pmStack_20->field_0x60 >> 9 & 1) == 0)) &&
              (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
            local_24 = local_24 + 1;
          }
        }
LAB_0024ecd3:
      }
      if ((local_24 != 0) &&
         (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
          ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))))) {
        if (local_24 == 1) {
          local_40 = mons_mname(&pm_guardian);
        }
        else {
          pcVar5 = mons_mname(&pm_guardian);
          local_40 = makeplural(pcVar5);
        }
        pcVar5 = "";
        if (local_24 == 1) {
          pcVar5 = "s";
        }
        pline("The %s appear%s to be angry too...",local_40,pcVar5);
      }
    }
  }
  return;
}

Assistant:

void setmangry(struct monst *mtmp)
{
	mtmp->mstrategy &= ~STRAT_WAITMASK;

	/* Even if the black marketeer is already angry he may not have called
	 * for his assistants if he or his staff have not been assaulted yet.
	 */
	if (Is_blackmarket(&u.uz) && !mtmp->mpeaceful && mtmp->isshk)
	    blkmar_guards(mtmp);

	if (!mtmp->mpeaceful) return;
	if (mtmp->mtame) return;
	mtmp->mpeaceful = 0;
	if (mtmp->ispriest) {
		if (p_coaligned(mtmp)) adjalign(-5); /* very bad */
		else adjalign(2);
	} else
		adjalign(-1);		/* attacking peaceful monsters is bad */
	if (couldsee(mtmp->mx, mtmp->my)) {
		if (humanoid(mtmp->data) || mtmp->isshk || mtmp->isgd)
		    pline("%s gets angry!", Monnam(mtmp));
		else if (flags.verbose && flags.soundok) growl(mtmp);
	}

	/* Don't misbehave in the Black Market or else... */
	if (Is_blackmarket(&u.uz)) {
	    if (mtmp->isshk) {
		blkmar_guards(mtmp);
	    } else if (NAME(mtmp) && *NAME(mtmp)) {
		/* non-tame named monsters are presumably
		 * black marketeer's assistants */
		struct monst *shkp = shop_keeper(level,
			inside_shop(level, mtmp->mx, mtmp->my));
		if (shkp)
		    wakeup(shkp);
	    }
	}

	/* attacking your own quest leader will anger his or her guardians */
	if (!flags.mon_moving &&	/* should always be the case here */
		mtmp->mnum == quest_info(MS_LEADER)) {
	    struct monst *mon;
	    int got_mad = 0;

	    /* guardians will sense this attack even if they can't see it */
	    for (mon = level->monlist; mon; mon = mon->nmon)
		if (!DEADMONSTER(mon) && mon->data == &pm_guardian && mon->mpeaceful) {
		    mon->mpeaceful = 0;
		    if (canseemon(level, mon)) ++got_mad;
		}
	    if (got_mad && !Hallucination)
		pline("The %s appear%s to be angry too...",
		      got_mad == 1 ? mons_mname(&pm_guardian) :
				    makeplural(mons_mname(&pm_guardian)),
		      got_mad == 1 ? "s" : "");
	}
}